

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

void google::protobuf::internal::VerifyVersion
               (int headerVersion,int minLibraryVersion,char *filename)

{
  LogMessage *this;
  int in_ESI;
  int in_EDI;
  undefined4 in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  LogMessage *in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  LogLevel_conflict level;
  LogMessage *in_stack_fffffffffffffe70;
  string local_118 [32];
  string local_f8 [20];
  int in_stack_ffffffffffffff1c;
  string local_98 [32];
  string local_78 [116];
  int local_4;
  
  level = (LogLevel_conflict)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  local_4 = in_EDI;
  if (0x2de9e9 < in_ESI) {
    LogMessage::LogMessage
              (in_stack_fffffffffffffe70,level,(char *)in_stack_fffffffffffffe60,
               in_stack_fffffffffffffe5c);
    LogMessage::operator<<
              (in_stack_fffffffffffffe60,
               (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    VersionString_abi_cxx11_(in_stack_ffffffffffffff1c);
    LogMessage::operator<<
              (in_stack_fffffffffffffe60,
               (string *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    LogMessage::operator<<
              (in_stack_fffffffffffffe60,
               (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    VersionString_abi_cxx11_(in_stack_ffffffffffffff1c);
    LogMessage::operator<<
              (in_stack_fffffffffffffe60,
               (string *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    LogMessage::operator<<
              (in_stack_fffffffffffffe60,
               (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    LogMessage::operator<<
              (in_stack_fffffffffffffe60,
               (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    LogMessage::operator<<
              (in_stack_fffffffffffffe60,
               (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffe60,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_78);
    LogMessage::~LogMessage((LogMessage *)0x3fe5b8);
  }
  if (local_4 < 0x2de9e8) {
    LogMessage::LogMessage
              (in_stack_fffffffffffffe70,level,(char *)in_stack_fffffffffffffe60,
               in_stack_fffffffffffffe5c);
    LogMessage::operator<<
              (in_stack_fffffffffffffe60,
               (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    VersionString_abi_cxx11_(in_stack_ffffffffffffff1c);
    LogMessage::operator<<
              (in_stack_fffffffffffffe60,
               (string *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    LogMessage::operator<<
              (in_stack_fffffffffffffe60,
               (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    VersionString_abi_cxx11_(in_stack_ffffffffffffff1c);
    LogMessage::operator<<
              (in_stack_fffffffffffffe60,
               (string *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    LogMessage::operator<<
              (in_stack_fffffffffffffe60,
               (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    LogMessage::operator<<
              (in_stack_fffffffffffffe60,
               (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    this = LogMessage::operator<<
                     (in_stack_fffffffffffffe60,
                      (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    LogFinisher::operator=
              ((LogFinisher *)this,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string(local_f8);
    LogMessage::~LogMessage((LogMessage *)0x3fe76a);
  }
  return;
}

Assistant:

void VerifyVersion(int headerVersion,
                   int minLibraryVersion,
                   const char* filename) {
  if (GOOGLE_PROTOBUF_VERSION < minLibraryVersion) {
    // Library is too old for headers.
    GOOGLE_LOG(FATAL)
      << "This program requires version " << VersionString(minLibraryVersion)
      << " of the Protocol Buffer runtime library, but the installed version "
         "is " << VersionString(GOOGLE_PROTOBUF_VERSION) << ".  Please update "
         "your library.  If you compiled the program yourself, make sure that "
         "your headers are from the same version of Protocol Buffers as your "
         "link-time library.  (Version verification failed in \""
      << filename << "\".)";
  }
  if (headerVersion < kMinHeaderVersionForLibrary) {
    // Headers are too old for library.
    GOOGLE_LOG(FATAL)
      << "This program was compiled against version "
      << VersionString(headerVersion) << " of the Protocol Buffer runtime "
         "library, which is not compatible with the installed version ("
      << VersionString(GOOGLE_PROTOBUF_VERSION) <<  ").  Contact the program "
         "author for an update.  If you compiled the program yourself, make "
         "sure that your headers are from the same version of Protocol Buffers "
         "as your link-time library.  (Version verification failed in \""
      << filename << "\".)";
  }
}